

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

CBlockIndex * __thiscall CChain::FindEarliestAtLeast(CChain *this,int64_t nTime,int height)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  reference ppCVar4;
  long in_FS_OFFSET;
  pair<long,_int> pVar5;
  const_iterator lower;
  pair<long,_int> blockparams;
  __normal_iterator<CBlockIndex_*const_*,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
  *in_stack_ffffffffffffff78;
  vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *in_stack_ffffffffffffff80;
  __normal_iterator<CBlockIndex_*const_*,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
  *in_stack_ffffffffffffff88;
  CBlockIndex *pCVar6;
  long local_18;
  int local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pVar5 = std::make_pair<long&,int&>
                    ((long *)in_stack_ffffffffffffff88,(int *)in_stack_ffffffffffffff80);
  local_18 = pVar5.first;
  local_10 = pVar5.second;
  cVar2 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::begin
                    (in_stack_ffffffffffffff80);
  cVar3 = std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::end(in_stack_ffffffffffffff80)
  ;
  std::
  lower_bound<__gnu_cxx::__normal_iterator<CBlockIndex*const*,std::vector<CBlockIndex*,std::allocator<CBlockIndex*>>>,std::pair<long,int>,CChain::FindEarliestAtLeast(long,int)const::__0>
            (cVar2._M_current,cVar3._M_current,&local_18);
  std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::end(in_stack_ffffffffffffff80);
  bVar1 = __gnu_cxx::
          operator==<CBlockIndex_*const_*,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                    (in_stack_ffffffffffffff88,
                     (__normal_iterator<CBlockIndex_*const_*,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
                      *)in_stack_ffffffffffffff80);
  if (bVar1) {
    pCVar6 = (CBlockIndex *)0x0;
  }
  else {
    ppCVar4 = __gnu_cxx::
              __normal_iterator<CBlockIndex_*const_*,_std::vector<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>_>
              ::operator*(in_stack_ffffffffffffff78);
    pCVar6 = *ppCVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return pCVar6;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* CChain::FindEarliestAtLeast(int64_t nTime, int height) const
{
    std::pair<int64_t, int> blockparams = std::make_pair(nTime, height);
    std::vector<CBlockIndex*>::const_iterator lower = std::lower_bound(vChain.begin(), vChain.end(), blockparams,
        [](CBlockIndex* pBlock, const std::pair<int64_t, int>& blockparams) -> bool { return pBlock->GetBlockTimeMax() < blockparams.first || pBlock->nHeight < blockparams.second; });
    return (lower == vChain.end() ? nullptr : *lower);
}